

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void ym2612_set_mute_mask(void *chip,UINT32 MuteMask)

{
  byte local_21;
  UINT8 CurChn;
  YM2612 *F2612;
  UINT32 MuteMask_local;
  void *chip_local;
  
  for (local_21 = 0; local_21 < 6; local_21 = local_21 + 1) {
    *(byte *)((long)chip + (ulong)local_21 * 0x198 + 0x4908) =
         (byte)(MuteMask >> (local_21 & 0x1f)) & 1;
  }
  *(byte *)((long)chip + 0x5110) = (byte)(MuteMask >> 6) & 1;
  return;
}

Assistant:

void ym2612_set_mute_mask(void *chip, UINT32 MuteMask)
{
	YM2612 *F2612 = (YM2612 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2612->CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	F2612->MuteDAC = (MuteMask >> 6) & 0x01;
	
	return;
}